

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall SQVM::Pop(SQVM *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectType SVar3;
  SQObjectPtr *pSVar4;
  SQTable *pSVar5;
  ulong uVar6;
  
  pSVar4 = (this->_stack)._vals;
  uVar6 = this->_top - 1;
  this->_top = uVar6;
  uVar6 = uVar6 & 0xffffffff;
  pSVar5 = pSVar4[uVar6].super_SQObject._unVal.pTable;
  SVar3 = pSVar4[uVar6].super_SQObject._type;
  pSVar2 = pSVar4 + uVar6;
  (pSVar2->super_SQObject)._type = 0;
  (pSVar2->super_SQObject)._flags = '\0';
  *(undefined3 *)&(pSVar2->super_SQObject).field_0x5 = 0;
  (pSVar2->super_SQObject)._unVal.pTable = (SQTable *)0x0;
  pSVar4[uVar6].super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      return;
    }
  }
  return;
}

Assistant:

inline T& operator[](size_type pos) const{ return _vals[pos]; }